

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O3

void __thiscall
aeron::ClientConductor::onAvailableImage
          (ClientConductor *this,int32_t streamId,int32_t sessionId,string *logFilename,
          string *sourceIdentity,int32_t subscriberPositionIndicatorId,
          int64_t subscriberPositionRegistrationId,int64_t correlationId)

{
  pointer pSVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Subscription *this_01;
  __pointer_type pIVar2;
  ulong uVar3;
  Image *pIVar4;
  long lVar5;
  int64_t subscriptionRegistrationId;
  int iVar6;
  _Atomic_word _Var7;
  ImageList *pIVar8;
  int64_t *piVar9;
  pointer pSVar10;
  ulong uVar11;
  bool bVar12;
  shared_ptr<aeron::LogBuffers> logBuffers;
  shared_ptr<aeron::LogBuffers> local_1c8;
  vector<aeron::ClientConductor::ImageListLingerDefn,std::allocator<aeron::ClientConductor::ImageListLingerDefn>>
  *local_1b8;
  _Any_data *local_1b0;
  _func_int **local_1a8;
  exception_handler_t *local_1a0;
  string *local_198;
  string *local_190;
  ImageList *local_188;
  longlong local_180;
  UnsafeBufferPosition subscriberPosition;
  Image image;
  
  local_198 = sourceIdentity;
  local_190 = logFilename;
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)&this->m_adminLock);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  pSVar10 = (this->m_subscriptions).
            super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->m_subscriptions).
           super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar10 != pSVar1) {
    local_1a0 = &this->m_errorHandler;
    local_1b0 = (_Any_data *)&this->m_epochClock;
    local_1b8 = (vector<aeron::ClientConductor::ImageListLingerDefn,std::allocator<aeron::ClientConductor::ImageListLingerDefn>>
                 *)&this->m_lingeringImageLists;
    local_1a8 = (_func_int **)&PTR__AtomicBuffer_00163200;
    do {
      if ((pSVar10->m_streamId == streamId) &&
         (this_00 = (pSVar10->m_subscription).
                    super___weak_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi, this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        _Var7 = this_00->_M_use_count;
        do {
          if (_Var7 == 0) goto LAB_001425b1;
          LOCK();
          iVar6 = this_00->_M_use_count;
          bVar12 = _Var7 == iVar6;
          if (bVar12) {
            this_00->_M_use_count = _Var7 + 1;
            iVar6 = _Var7;
          }
          _Var7 = iVar6;
          UNLOCK();
        } while (!bVar12);
        if ((this_00->_M_use_count != 0) &&
           (this_01 = (pSVar10->m_subscription).
                      super___weak_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
           this_01 != (Subscription *)0x0)) {
          pIVar2 = (this_01->m_imageList)._M_b._M_p;
          uVar3 = pIVar2->m_length;
          if (uVar3 == 0) {
LAB_0014240d:
            if (this_01->m_registrationId == subscriberPositionRegistrationId) {
              image._vptr_Image = (_func_int **)(local_190->_M_dataplus)._M_p;
              logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<aeron::LogBuffers,std::allocator<aeron::LogBuffers>,char_const*>
                        (&logBuffers.
                          super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,(LogBuffers **)&logBuffers,
                         (allocator<aeron::LogBuffers> *)&subscriberPosition,(char **)&image);
              subscriberPosition.m_buffer._vptr_AtomicBuffer = local_1a8;
              subscriberPosition.m_buffer.m_length = this->m_counterValuesBuffer->m_length;
              subscriberPosition.m_buffer.m_buffer = this->m_counterValuesBuffer->m_buffer;
              subscriptionRegistrationId = this_01->m_registrationId;
              local_1c8.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
              local_1c8.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              if (logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              subscriberPosition.m_id = subscriberPositionIndicatorId;
              subscriberPosition.m_offset = subscriberPositionIndicatorId << 7;
              Image::Image(&image,sessionId,correlationId,subscriptionRegistrationId,local_198,
                           &subscriberPosition,&local_1c8,local_1a0);
              if (local_1c8.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_1c8.
                           super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if ((pSVar10->m_onAvailableImageHandler).super__Function_base._M_manager ==
                  (_Manager_type)0x0) {
                std::__throw_bad_function_call();
              }
              (*(pSVar10->m_onAvailableImageHandler)._M_invoker)
                        ((_Any_data *)&pSVar10->m_onAvailableImageHandler,&image);
              pIVar8 = Subscription::addImage(this_01,&image);
              if (pIVar8 != (ImageList *)0x0) {
                if ((this->m_epochClock).super__Function_base._M_manager == (_Manager_type)0x0) {
                  std::__throw_bad_function_call();
                }
                local_180 = (*(this->m_epochClock)._M_invoker)(local_1b0);
                local_188 = pIVar8;
                std::
                vector<aeron::ClientConductor::ImageListLingerDefn,std::allocator<aeron::ClientConductor::ImageListLingerDefn>>
                ::emplace_back<long_long&,aeron::ImageList*&>(local_1b8,&local_180,&local_188);
              }
              Image::~Image(&image);
              if (logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (logBuffers.
                           super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
            }
          }
          else {
            pIVar4 = pIVar2->m_images;
            if (pIVar4->m_correlationId != correlationId) {
              uVar11 = 0;
              piVar9 = &pIVar4[1].m_correlationId;
              do {
                if (uVar3 - 1 == uVar11) goto LAB_0014240d;
                uVar11 = uVar11 + 1;
                lVar5 = *piVar9;
                piVar9 = piVar9 + 0x25;
              } while (lVar5 != correlationId);
              if (uVar3 <= uVar11) goto LAB_0014240d;
            }
          }
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
LAB_001425b1:
      pSVar10 = pSVar10 + 1;
    } while (pSVar10 != pSVar1);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_adminLock);
  return;
}

Assistant:

void ClientConductor::onAvailableImage(
    std::int32_t streamId,
    std::int32_t sessionId,
    const std::string &logFilename,
    const std::string &sourceIdentity,
    std::int32_t subscriberPositionIndicatorId,
    std::int64_t subscriberPositionRegistrationId,
    std::int64_t correlationId)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    std::for_each(m_subscriptions.begin(), m_subscriptions.end(),
        [&](const SubscriptionStateDefn &entry)
        {
            if (streamId == entry.m_streamId)
            {
                std::shared_ptr<Subscription> subscription = entry.m_subscription.lock();

                if (subscription != nullptr &&
                    !(subscription->hasImage(correlationId)) &&
                    subscriberPositionRegistrationId == subscription->registrationId())
                {
                    std::shared_ptr<LogBuffers> logBuffers = std::make_shared<LogBuffers>(logFilename.c_str());

                    UnsafeBufferPosition subscriberPosition(m_counterValuesBuffer, subscriberPositionIndicatorId);

                    Image image(
                        sessionId,
                        correlationId,
                        subscription->registrationId(),
                        sourceIdentity,
                        subscriberPosition,
                        logBuffers,
                        m_errorHandler);

                    entry.m_onAvailableImageHandler(image);

                    struct ImageList *oldImageList = subscription->addImage(image);

                    if (nullptr != oldImageList)
                    {
                        lingerResource(m_epochClock(), oldImageList);
                    }
                }
            }
        });
}